

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O1

void __thiscall
BuildingInfoIRCCommand::trigger
          (BuildingInfoIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  int iVar1;
  char cVar2;
  undefined4 uVar3;
  long lVar4;
  size_type sVar5;
  _Fwd_list_node_base _Var6;
  char *pcVar7;
  size_t sVar8;
  bool bVar9;
  long *plVar10;
  bool bVar11;
  long *plVar12;
  forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nStrings;
  forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  gStrings;
  string str;
  _Fwd_list_impl local_b0;
  _Fwd_list_impl local_a8;
  _Fwd_list_impl local_a0;
  _Fwd_list_impl local_98;
  char *local_90;
  undefined4 local_84;
  long *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  long *local_58;
  long *local_50;
  long local_48;
  long *local_40;
  long *local_38;
  
  pcVar7 = channel._M_str;
  sVar8 = channel._M_len;
  lVar4 = Jupiter::IRC::Client::getChannel(source,sVar8,pcVar7,pcVar7,nick._M_len,nick._M_str);
  if (lVar4 != 0) {
    uVar3 = Jupiter::IRC::Client::Channel::getType();
    local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
    local_a0._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
    local_a8._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
    local_b0._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
    RenX::getCore();
    RenX::Core::getServers();
    local_40 = local_50;
    bVar11 = false;
    plVar12 = local_58;
    local_90 = pcVar7;
    if (local_58 != local_50) {
      do {
        local_84 = uVar3;
        cVar2 = RenX::Server::isLogChanType((int)*plVar12);
        plVar10 = plVar12;
        if (cVar2 != '\0') {
          plVar10 = *(long **)(*plVar12 + 0x28);
          local_38 = *(long **)(*plVar12 + 0x30);
          pcVar7 = local_90;
          local_80 = plVar12;
          if (plVar10 != local_38) {
            bVar11 = false;
            do {
              sVar5 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)*plVar10,"Rx_Building_Air",0,0xf);
              bVar9 = bVar11;
              if ((sVar5 != 0) || (bVar9 = true, !bVar11)) {
                local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_78,pluginInstance.m_buildingInfoFormat._M_dataplus._M_p,
                           pluginInstance.m_buildingInfoFormat._M_dataplus._M_p +
                           pluginInstance.m_buildingInfoFormat._M_string_length);
                RenX::processTags((string *)&local_78,(Server *)*local_80,(PlayerInfo *)0x0,
                                  (PlayerInfo *)0x0,(BuildingInfo *)*plVar10);
                pcVar7 = local_90;
                if (*(char *)(*plVar10 + 0x34) == '\x01') {
                  _Var6._M_next =
                       &std::
                        _Fwd_list_base<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        _M_create_node<std::__cxx11::string_const&>
                                  ((_Fwd_list_base<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)&local_b0,&local_78)->super__Fwd_list_node_base;
                  ((_Fwd_list_node_base *)&(_Var6._M_next)->_M_next)->_M_next =
                       (_Fwd_list_node_base *)local_b0._M_head._M_next;
                  local_b0._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)_Var6._M_next
                  ;
                }
                else {
                  iVar1 = *(int *)(*plVar10 + 0x20);
                  if (iVar1 == 1) {
                    _Var6._M_next =
                         &std::
                          _Fwd_list_base<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                          ::_M_create_node<std::__cxx11::string_const&>
                                    ((_Fwd_list_base<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                      *)&local_a0,&local_78)->super__Fwd_list_node_base;
                    ((_Fwd_list_node_base *)&(_Var6._M_next)->_M_next)->_M_next =
                         (_Fwd_list_node_base *)local_a0._M_head._M_next;
                    local_a0._M_head._M_next =
                         (_Fwd_list_node_base)(_Fwd_list_node_base)_Var6._M_next;
                  }
                  else if (iVar1 == 0) {
                    _Var6._M_next =
                         &std::
                          _Fwd_list_base<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                          ::_M_create_node<std::__cxx11::string_const&>
                                    ((_Fwd_list_base<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                      *)&local_98,&local_78)->super__Fwd_list_node_base;
                    ((_Fwd_list_node_base *)&(_Var6._M_next)->_M_next)->_M_next =
                         (_Fwd_list_node_base *)local_98._M_head._M_next;
                    local_98._M_head._M_next =
                         (_Fwd_list_node_base)(_Fwd_list_node_base)_Var6._M_next;
                  }
                  else {
                    _Var6._M_next =
                         &std::
                          _Fwd_list_base<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                          ::_M_create_node<std::__cxx11::string_const&>
                                    ((_Fwd_list_base<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                      *)&local_a8,&local_78)->super__Fwd_list_node_base;
                    ((_Fwd_list_node_base *)&(_Var6._M_next)->_M_next)->_M_next =
                         (_Fwd_list_node_base *)local_a8._M_head._M_next;
                    local_a8._M_head._M_next =
                         (_Fwd_list_node_base)(_Fwd_list_node_base)_Var6._M_next;
                  }
                }
                bVar11 = bVar9;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p != &local_78.field_2) {
                  operator_delete(local_78._M_dataplus._M_p,
                                  local_78.field_2._M_allocated_capacity + 1);
                }
              }
              plVar10 = plVar10 + 1;
            } while (plVar10 != local_38);
          }
          while (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
            std::
            _Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase_after((_Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_98,&local_98._M_head);
            Jupiter::IRC::Client::sendMessage
                      (source,sVar8,pcVar7,*(undefined8 *)((long)local_98._M_head._M_next + 0x10),
                       (((__aligned_buffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)((long)local_98._M_head._M_next + 8))->_M_storage).__align);
          }
          while (local_a0._M_head._M_next != (_Fwd_list_node_base *)0x0) {
            std::
            _Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase_after((_Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_a0,&local_a0._M_head);
            Jupiter::IRC::Client::sendMessage
                      (source,sVar8,pcVar7,*(undefined8 *)((long)local_a0._M_head._M_next + 0x10),
                       (((__aligned_buffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)((long)local_a0._M_head._M_next + 8))->_M_storage).__align);
          }
          while (local_a8._M_head._M_next != (_Fwd_list_node_base *)0x0) {
            std::
            _Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase_after((_Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_a8,&local_a8._M_head);
            Jupiter::IRC::Client::sendMessage
                      (source,sVar8,pcVar7,*(undefined8 *)((long)local_a8._M_head._M_next + 0x10),
                       (((__aligned_buffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)((long)local_a8._M_head._M_next + 8))->_M_storage).__align);
          }
          while (local_b0._M_head._M_next != (_Fwd_list_node_base *)0x0) {
            std::
            _Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase_after((_Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_b0,&local_b0._M_head);
            Jupiter::IRC::Client::sendMessage
                      (source,sVar8,pcVar7,*(undefined8 *)((long)local_b0._M_head._M_next + 0x10),
                       (((__aligned_buffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)((long)local_b0._M_head._M_next + 8))->_M_storage).__align);
          }
          bVar11 = true;
          plVar10 = local_80;
        }
        plVar12 = plVar10 + 1;
        uVar3 = local_84;
      } while (plVar10 + 1 != local_40);
    }
    if (local_58 != (long *)0x0) {
      operator_delete(local_58,local_48 - (long)local_58);
    }
    if (!bVar11) {
      Jupiter::IRC::Client::sendMessage
                (source,sVar8,local_90,0x40,
                 "Error: Channel not attached to any connected Renegade X servers.");
    }
    std::
    _Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Fwd_list_base((_Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_b0);
    std::
    _Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Fwd_list_base((_Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_a8);
    std::
    _Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Fwd_list_base((_Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_a0);
    std::
    _Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Fwd_list_base((_Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_98);
  }
  return;
}

Assistant:

void BuildingInfoIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan == nullptr) {
		return;
	}

	int type = chan->getType();
	bool seenStrip;
	bool foundServer{};
	std::forward_list<std::string> gStrings;
	std::forward_list<std::string> nStrings;
	std::forward_list<std::string> oStrings;
	std::forward_list<std::string> cStrings;
	for (const auto& server : RenX::getCore()->getServers()) {
		if (server->isLogChanType(type)) {
			foundServer = true;
			seenStrip = false;
			for (const auto& building : server->buildings){
				if (building->name.find("Rx_Building_Air"sv) == 0) {
					if (seenStrip) {
						continue;
					}

					seenStrip = true;
				}
				std::string str(pluginInstance.getBuildingInfoFormat());
				RenX::processTags(str, server, nullptr, nullptr, building.get());

				if (building->capturable)
					cStrings.push_front(str);
				else if (building->team == RenX::TeamType::GDI)
					gStrings.push_front(str);
				else if (building->team == RenX::TeamType::Nod)
					nStrings.push_front(str);
				else
					oStrings.push_front(str);
			}

			while (gStrings.empty() == false) {
				gStrings.pop_front();
				source->sendMessage(channel, gStrings.front());
			}
			while (nStrings.empty() == false) {
				nStrings.pop_front();
				source->sendMessage(channel, nStrings.front());
			}
			while (oStrings.empty() == false) {
				oStrings.pop_front();
				source->sendMessage(channel, oStrings.front());
			}
			while (cStrings.empty() == false) {
				cStrings.pop_front();
				source->sendMessage(channel, cStrings.front());
			}
		}
	}

	if (!foundServer) {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
	}
}